

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::_first_real_span_bin(basic_substring<const_char> *this,size_t pos)

{
  char *pcVar1;
  char cVar2;
  basic_substring<const_char> bVar3;
  error_flags eVar4;
  ulong uVar5;
  ulong in_RSI;
  long *in_RDI;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  char c_2;
  char c_1;
  char c;
  bool powchars;
  bool fracchars;
  bool intchars;
  undefined4 in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb4;
  char *in_stack_fffffffffffffbb8;
  undefined7 in_stack_fffffffffffffbc0;
  undefined1 in_stack_fffffffffffffbc7;
  ulong local_238;
  char *local_228;
  size_t local_220;
  char *local_1f8;
  size_t local_1f0;
  char *local_1c8;
  size_t local_1c0;
  char *local_198;
  size_t local_190;
  char *local_168;
  size_t local_160;
  char *local_138;
  size_t local_130;
  char *local_108;
  size_t local_100;
  char *local_d8;
  size_t local_d0;
  char *local_a8;
  size_t local_a0;
  char *local_78;
  size_t local_70;
  char *local_48;
  size_t local_40;
  char *local_18;
  size_t local_10;
  
  bVar8 = false;
  bVar6 = false;
  for (local_238 = in_RSI; local_238 < (ulong)in_RDI[1]; local_238 = local_238 + 1) {
    cVar2 = *(char *)(*in_RDI + local_238);
    if ((cVar2 != '0') && (cVar2 != '1')) {
      if (cVar2 == '.') {
        uVar5 = local_238 + 1;
        if (uVar5 == 0) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            trap_instruction();
          }
          handle_error(0x345f1b,(char *)0x1999,"check failed: %s","pos > 0");
        }
        pcVar1 = (char *)(*in_RDI + local_238);
        local_238 = uVar5;
        if (*pcVar1 != '.') {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            trap_instruction();
          }
          handle_error(0x345f1b,(char *)0x199a,"check failed: %s","str[pos - 1] == \'.\'");
        }
        goto LAB_00282509;
      }
      uVar5 = local_238;
      if ((cVar2 == 'p') || (cVar2 == 'P')) goto LAB_00282cf6;
      bVar6 = true;
      if ((((cVar2 != ' ') && (bVar6 = true, cVar2 != '\n')) && (bVar6 = true, cVar2 != ']')) &&
         ((((bVar6 = true, cVar2 != ')' && (bVar6 = true, cVar2 != '}')) &&
           ((bVar6 = true, cVar2 != ',' &&
            ((bVar6 = true, cVar2 != ';' && (bVar6 = true, cVar2 != '\r')))))) &&
          (bVar6 = true, cVar2 != '\t')))) {
        bVar6 = cVar2 == '\0';
      }
      if (bVar6) {
        if (bVar8) {
          if ((ulong)in_RDI[1] < local_238 && local_238 != 0xffffffffffffffff) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
              trap_instruction();
            }
            handle_error(0x345f1b,(char *)0x154e,"check failed: %s","num <= len || num == npos");
          }
          basic_substring((basic_substring<const_char> *)
                          CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                          in_stack_fffffffffffffbb8,
                          CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
          local_228 = local_18;
          local_220 = local_10;
        }
        else {
          basic_substring((basic_substring<const_char> *)
                          CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                          in_stack_fffffffffffffbb8,
                          CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
          local_228 = local_48;
          local_220 = local_40;
        }
      }
      else {
        basic_substring((basic_substring<const_char> *)
                        CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                        in_stack_fffffffffffffbb8,
                        CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
        local_228 = local_78;
        local_220 = local_70;
      }
      goto LAB_00283472;
    }
    bVar8 = true;
  }
  if (bVar8) {
    local_228 = (char *)*in_RDI;
    local_220 = in_RDI[1];
  }
  else {
    basic_substring((basic_substring<const_char> *)
                    CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                    in_stack_fffffffffffffbb8,
                    CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    local_228 = local_a8;
    local_220 = local_a0;
  }
  goto LAB_00283472;
LAB_00282509:
  if ((ulong)in_RDI[1] <= local_238) goto LAB_00282b45;
  cVar2 = *(char *)(*in_RDI + local_238);
  if ((cVar2 != '0') && (cVar2 != '1')) {
    uVar5 = local_238;
    if ((cVar2 == 'p') || (cVar2 == 'P')) goto LAB_00282cf6;
    bVar7 = true;
    if ((((((cVar2 != ' ') && (bVar7 = true, cVar2 != '\n')) && (bVar7 = true, cVar2 != ']')) &&
         ((bVar7 = true, cVar2 != ')' && (bVar7 = true, cVar2 != '}')))) &&
        (bVar7 = true, cVar2 != ',')) &&
       (((bVar7 = true, cVar2 != ';' && (bVar7 = true, cVar2 != '\r')) &&
        (bVar7 = true, cVar2 != '\t')))) {
      bVar7 = cVar2 == '\0';
    }
    if (bVar7) {
      if ((bVar8) || (bVar6)) {
        if ((ulong)in_RDI[1] < local_238 && local_238 != 0xffffffffffffffff) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
            trap_instruction();
          }
          handle_error(0x345f1b,(char *)0x154e,"check failed: %s","num <= len || num == npos");
        }
        basic_substring((basic_substring<const_char> *)
                        CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                        in_stack_fffffffffffffbb8,
                        CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
        local_228 = local_d8;
        local_220 = local_d0;
      }
      else {
        basic_substring((basic_substring<const_char> *)
                        CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                        in_stack_fffffffffffffbb8,
                        CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
        local_228 = local_108;
        local_220 = local_100;
      }
    }
    else {
      basic_substring((basic_substring<const_char> *)
                      CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                      in_stack_fffffffffffffbb8,
                      CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      local_228 = local_138;
      local_220 = local_130;
    }
    goto LAB_00283472;
  }
  bVar6 = true;
  local_238 = local_238 + 1;
  goto LAB_00282509;
LAB_00282b45:
  if ((bVar8) || (bVar6)) {
    local_228 = (char *)*in_RDI;
    local_220 = in_RDI[1];
  }
  else {
    basic_substring((basic_substring<const_char> *)
                    CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                    in_stack_fffffffffffffbb8,
                    CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    local_228 = local_168;
    local_220 = local_160;
  }
  goto LAB_00283472;
LAB_00282cf6:
  local_238 = uVar5 + 1;
  if (local_238 == 0) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      trap_instruction();
    }
    handle_error(0x345f1b,(char *)0x19b4,"check failed: %s","pos > 0");
  }
  bVar7 = true;
  if (*(char *)(*in_RDI + uVar5) != 'p') {
    bVar7 = *(char *)(*in_RDI + uVar5) == 'P';
  }
  if (!bVar7) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      trap_instruction();
    }
    handle_error(0x345f1b,(char *)0x19b5,"check failed: %s",
                 "str[pos - 1] == \'p\' || str[pos - 1] == \'P\'");
  }
  if (((uVar5 + 2 < (ulong)in_RDI[1]) &&
      ((*(char *)(*in_RDI + local_238) == '+' || (*(char *)(*in_RDI + local_238) == '-')))) &&
     ((bVar8 || (bVar6)))) {
    bVar8 = false;
    for (local_238 = uVar5 + 2; local_238 < (ulong)in_RDI[1]; local_238 = local_238 + 1) {
      cVar2 = *(char *)(*in_RDI + local_238);
      if ((cVar2 < '0') || ('9' < cVar2)) {
        if (bVar8) {
          bVar8 = true;
          if (((((cVar2 != ' ') && (bVar8 = true, cVar2 != '\n')) && (bVar8 = true, cVar2 != ']'))
              && (((bVar8 = true, cVar2 != ')' && (bVar8 = true, cVar2 != '}')) &&
                  ((bVar8 = true, cVar2 != ',' &&
                   ((bVar8 = true, cVar2 != ';' && (bVar8 = true, cVar2 != '\r')))))))) &&
             (bVar8 = true, cVar2 != '\t')) {
            bVar8 = cVar2 == '\0';
          }
          if (bVar8) {
            if ((ulong)in_RDI[1] < local_238 && local_238 != 0xffffffffffffffff) {
              eVar4 = get_error_flags();
              if (((eVar4 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
                trap_instruction();
              }
              handle_error(0x345f1b,(char *)0x154e,"check failed: %s","num <= len || num == npos");
            }
            basic_substring((basic_substring<const_char> *)
                            CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                            in_stack_fffffffffffffbb8,
                            CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
            local_228 = local_1c8;
            local_220 = local_1c0;
            goto LAB_00283472;
          }
        }
        basic_substring((basic_substring<const_char> *)CONCAT17(1,in_stack_fffffffffffffbc0),
                        (char *)in_RDI,CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0)
                       );
        local_228 = local_1f8;
        local_220 = local_1f0;
        goto LAB_00283472;
      }
      bVar8 = true;
    }
    local_228 = (char *)*in_RDI;
    local_220 = in_RDI[1];
  }
  else {
    basic_substring((basic_substring<const_char> *)
                    CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                    in_stack_fffffffffffffbb8,
                    CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    local_228 = local_198;
    local_220 = local_190;
  }
LAB_00283472:
  bVar3.len = local_220;
  bVar3.str = local_228;
  return bVar3;
}

Assistant:

C4_NO_INLINE C4_PURE basic_substring _first_real_span_bin(size_t pos) const noexcept
    {
        bool intchars = false;
        bool fracchars = false;
        bool powchars;
        // integral part
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(c == '0' || c == '1')
            {
                intchars = true;
            }
            else if(c == '.')
            {
                ++pos;
                goto fractional_part_bin;
            }
            else if(c == 'p' || c == 'P')
            {
                ++pos;
                goto power_part_bin;
            }
            else if(_is_delim_char(c))
            {
                return intchars ? first(pos) : first(0);
            }
            else
            {
                return first(0);
            }
        }
        // no . or p were found; this is either an integral number
        // or not a number at all
        return intchars ?
            *this :
            first(0);
    fractional_part_bin:
        C4_ASSERT(pos > 0);
        C4_ASSERT(str[pos - 1] == '.');
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(c == '0' || c == '1')
            {
                fracchars = true;
            }
            else if(c == 'p' || c == 'P')
            {
                ++pos;
                goto power_part_bin;
            }
            else if(_is_delim_char(c))
            {
                return intchars || fracchars ? first(pos) : first(0);
            }
            else
            {
                return first(0);
            }
        }
        return intchars || fracchars ?
            *this :
            first(0);
    power_part_bin:
        C4_ASSERT(pos > 0);
        C4_ASSERT(str[pos - 1] == 'p' || str[pos - 1] == 'P');
        // either a + or a - is expected here, followed by more chars.
        // also, using (pos+1) in this check will cause an early
        // return when no more chars follow the sign.
        if(len <= (pos+1) || (str[pos] != '+' && str[pos] != '-') || ((!intchars) && (!fracchars)))
            return first(0);
        ++pos; // this was the sign.
        // ... so the (pos+1) ensures that we enter the loop and
        // hence that there exist chars in the power part
        powchars = false;
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(c >= '0' && c <= '9')
                powchars = true;
            else if(powchars && _is_delim_char(c))
                return first(pos);
            else
                return first(0);
        }
        return *this;
    }